

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
InsertUniqueInTree(InnerMap *this,size_type b,Node *node)

{
  long in_RCX;
  set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
  *in_RSI;
  iterator *in_RDI;
  size_type in_stack_ffffffffffffff98;
  InnerMap *in_stack_ffffffffffffffa0;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *in_stack_ffffffffffffffa8;
  TreeIterator in_stack_ffffffffffffffb0;
  
  *(undefined8 *)(in_RCX + 0x18) = 0;
  KeyPtrFromNodePtr((Node *)0x43446a);
  std::
  set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
  ::insert(in_RSI,(value_type *)in_RDI);
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  ::iterator_base(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0,
                  in_stack_ffffffffffffff98);
  return in_RDI;
}

Assistant:

iterator InsertUniqueInTree(size_type b, Node* node) {
      GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
      // Maintain the invariant that node->next is NULL for all Nodes in Trees.
      node->next = NULL;
      return iterator(
          static_cast<Tree*>(table_[b])->insert(KeyPtrFromNodePtr(node)).first,
          this, b & ~static_cast<size_t>(1));
    }